

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_sched.c
# Opt level: O1

double clock_gettimesincewithunits(double prevsystime,double units,int sampflag)

{
  double dVar1;
  
  if (sampflag == 0) {
    dVar1 = units * 14112.0;
  }
  else {
    dVar1 = (14112000.0 / (double)(pd_maininstance.pd_stuff)->st_dacsr) * units;
  }
  return (pd_maininstance.pd_systime - prevsystime) / dVar1;
}

Assistant:

double clock_gettimesincewithunits(double prevsystime,
    double units, int sampflag)
{
            /* If in samples, divide TIMEUNITPERSECOND/sys_dacsr first (at
            cost of an extra division) since it's probably an integer and if
            units == 1 and (sys_time - prevsystime) is an integer number of
            DSP ticks, the result will be exact. */
    if (sampflag)
        return ((pd_this->pd_systime - prevsystime)/
            ((TIMEUNITPERSECOND/STUFF->st_dacsr)*units));
    else return ((pd_this->pd_systime - prevsystime)/(TIMEUNITPERMSEC*units));
}